

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_allocation.c
# Opt level: O0

void PaUtil_FreeAllAllocations(PaUtilAllocationGroup *group)

{
  PaUtilAllocationGroupLink *local_20;
  PaUtilAllocationGroupLink *previous;
  PaUtilAllocationGroupLink *current;
  PaUtilAllocationGroup *group_local;
  
  previous = group->allocations;
  local_20 = (PaUtilAllocationGroupLink *)0x0;
  for (; previous != (PaUtilAllocationGroupLink *)0x0; previous = previous->next) {
    PaUtil_FreeMemory(previous->buffer);
    previous->buffer = (void *)0x0;
    local_20 = previous;
  }
  if (local_20 != (PaUtilAllocationGroupLink *)0x0) {
    local_20->next = group->spareLinks;
    group->spareLinks = group->allocations;
    group->allocations = (PaUtilAllocationGroupLink *)0x0;
  }
  return;
}

Assistant:

void PaUtil_FreeAllAllocations( PaUtilAllocationGroup* group )
{
    struct PaUtilAllocationGroupLink *current = group->allocations;
    struct PaUtilAllocationGroupLink *previous = 0;

    /* free all buffers in the allocations list */
    while( current )
    {
        PaUtil_FreeMemory( current->buffer );
        current->buffer = 0;

        previous = current;
        current = current->next;
    }

    /* link the former allocations list onto the front of the spareLinks list */
    if( previous )
    {
        previous->next = group->spareLinks;
        group->spareLinks = group->allocations;
        group->allocations = 0;
    }
}